

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.hpp
# Opt level: O0

lock_handle<int,_std::shared_timed_mutex> * __thiscall
gmlc::libguarded::try_lock_handle<int,std::shared_timed_mutex>
          (lock_handle<int,_std::shared_timed_mutex> *__return_storage_ptr__,libguarded *this,
          int *obj,shared_timed_mutex *gmutex)

{
  bool bVar1;
  unique_lock<std::shared_timed_mutex> local_68;
  undefined4 local_58;
  unique_lock<std::shared_timed_mutex> local_48;
  undefined1 local_30 [8];
  lock_type glock;
  shared_timed_mutex *gmutex_local;
  int *obj_local;
  
  glock._8_8_ = obj;
  std::unique_lock<std::shared_timed_mutex>::unique_lock
            ((unique_lock<std::shared_timed_mutex> *)local_30,obj);
  bVar1 = std::unique_lock<std::shared_timed_mutex>::owns_lock
                    ((unique_lock<std::shared_timed_mutex> *)local_30);
  if (bVar1) {
    std::unique_lock<std::shared_timed_mutex>::unique_lock
              (&local_48,(unique_lock<std::shared_timed_mutex> *)local_30);
    lock_handle<int,_std::shared_timed_mutex>::lock_handle
              (__return_storage_ptr__,(pointer)this,&local_48);
    std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_48);
  }
  else {
    std::unique_lock<std::shared_timed_mutex>::unique_lock
              (&local_68,(unique_lock<std::shared_timed_mutex> *)local_30);
    lock_handle<int,_std::shared_timed_mutex>::lock_handle
              (__return_storage_ptr__,(pointer)0x0,&local_68);
    std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_68);
  }
  local_58 = 1;
  std::unique_lock<std::shared_timed_mutex>::~unique_lock
            ((unique_lock<std::shared_timed_mutex> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

lock_handle<T, M> try_lock_handle(T* obj, M& gmutex)
{
    typename lock_handle<T, M>::lock_type glock(gmutex, std::try_to_lock);
    if (glock.owns_lock()) {
        return lock_handle<T, M>(obj, std::move(glock));
    } else {
        return lock_handle<T, M>(nullptr, std::move(glock));
    }
}